

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  DecodeStatus In;
  uint local_3c;
  uint Rn;
  uint imm;
  uint add;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  imm = 3;
  _add = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Val,0xc,1);
  local_3c = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xd,4);
  In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_add);
  _Var1 = Check(&imm,In);
  if (_Var1) {
    if (uVar2 == 0) {
      local_3c = -local_3c;
    }
    if ((local_3c == 0) && (uVar2 == 0)) {
      local_3c = 0x80000000;
    }
    MCOperand_CreateImm0(pMStack_18,(ulong)local_3c);
    Inst_local._4_4_ = imm;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned add = fieldFromInstruction_4(Val, 12, 1);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (!add) imm *= (unsigned int)-1;
	if (imm == 0 && !add) imm = (unsigned int)INT32_MIN;
	MCOperand_CreateImm0(Inst, imm);
	//if (Rn == 15)
	//  tryAddingPcLoadReferenceComment(Address, Address + imm + 8, Decoder);

	return S;
}